

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall Timer::Tick(Timer *this)

{
  TimeEvent *pTVar1;
  bool bVar2;
  reference ppTVar3;
  double dVar4;
  Socket_Exception *e;
  Database_Exception *e_1;
  runtime_error *e_2;
  logic_error *e_3;
  exception *e_4;
  _Self local_48;
  _Self local_40;
  TimeEvent *local_38;
  TimeEvent *timer;
  iterator __end1;
  iterator __begin1;
  set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_> *__range1;
  double currenttime;
  Timer *this_local;
  
  dVar4 = GetTime();
  if ((this->changed & 1U) != 0) {
    std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::operator=
              (&this->execlist,&this->timers);
    this->changed = false;
  }
  __end1 = std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::begin
                     (&this->execlist);
  timer = (TimeEvent *)
          std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::end
                    (&this->execlist);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&timer), bVar2) {
    ppTVar3 = std::_Rb_tree_const_iterator<TimeEvent_*>::operator*(&__end1);
    local_38 = *ppTVar3;
    local_40._M_node =
         (_Base_ptr)
         std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::find
                   (&this->timers,&local_38);
    local_48._M_node =
         (_Base_ptr)
         std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::end
                   (&this->timers);
    bVar2 = std::operator==(&local_40,&local_48);
    if ((!bVar2) && (local_38->lasttime + local_38->speed < dVar4)) {
      local_38->lasttime = local_38->speed + local_38->lasttime;
      if ((local_38->lifetime != -1) &&
         (local_38->lifetime = local_38->lifetime + -1, local_38->lifetime == 0)) {
        Unregister(this,local_38);
      }
      (*local_38->callback)(local_38->param);
      pTVar1 = local_38;
      if ((local_38->manager == (Timer *)0x0) && (local_38 != (TimeEvent *)0x0)) {
        TimeEvent::~TimeEvent(local_38);
        operator_delete(pTVar1,0x30);
      }
    }
    std::_Rb_tree_const_iterator<TimeEvent_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void Timer::Tick()
{
	double currenttime = Timer::GetTime();

	if (this->changed)
	{
		this->execlist = this->timers;
		this->changed = false;
	}

	UTIL_FOREACH(this->execlist, timer)
	{
		if (this->timers.find(timer) == this->timers.end())
			continue;

		if (timer->lasttime + timer->speed < currenttime)
		{
			timer->lasttime += timer->speed;

			if (timer->lifetime != Timer::FOREVER)
			{
				--timer->lifetime;

				if (timer->lifetime == 0)
				{
					this->Unregister(timer);
				}
			}

#ifndef DEBUG_EXCEPTIONS
			try
			{
#endif // DEBUG_EXCEPTIONS
				timer->callback(timer->param);
#ifndef DEBUG_EXCEPTIONS
			}
			catch (Socket_Exception& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("%s: %s", e.what(), e.error());
			}
			catch (Database_Exception& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("%s: %s", e.what(), e.error());
			}
			catch (std::runtime_error& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("Runtime Error: %s", e.what());
			}
			catch (std::logic_error& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("Logic Error: %s", e.what());
			}
			catch (std::exception& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("Uncaught Exception: %s", e.what());
			}
			catch (...)
			{
				Console::Err("Timer callback caused an exception");
			}
#endif // DEBUG_EXCEPTIONS

			if (timer->manager == 0)
				delete timer;
		}
	}
}